

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageTimer.cpp
# Opt level: O0

void __thiscall
helics::MessageTimer::MessageTimer
          (MessageTimer *this,function<void_(helics::ActionMessage_&&)> *sFunction)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  long in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  string *in_stack_00000008;
  AsioContextManager *in_stack_00000108;
  function<void_(helics::ActionMessage_&&)> *in_stack_ffffffffffffff78;
  
  std::enable_shared_from_this<helics::MessageTimer>::enable_shared_from_this
            ((enable_shared_from_this<helics::MessageTimer> *)0x6a8e0b);
  std::mutex::mutex((mutex *)0x6a8e19);
  this_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(in_RDI + 0x38);
  std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>::vector
            ((vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_> *)0x6a8e2c);
  std::
  vector<std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_std::allocator<std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>_>
  ::vector((vector<std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_std::allocator<std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>_>
            *)0x6a8e3f);
  std::function<void_(helics::ActionMessage_&&)>::function
            ((function<void_(helics::ActionMessage_&&)> *)this_00,in_stack_ffffffffffffff78);
  std::
  vector<std::shared_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>_>,_std::allocator<std::shared_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>_>_>_>
  ::vector((vector<std::shared_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>_>,_std::allocator<std::shared_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>_>_>_>
            *)0x6a8e6d);
  std::__cxx11::string::string(in_RSI);
  gmlc::networking::AsioContextManager::getContextPointer(in_stack_00000008);
  std::__cxx11::string::~string(this_00);
  std::
  __shared_ptr_access<gmlc::networking::AsioContextManager,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  ::operator->((__shared_ptr_access<gmlc::networking::AsioContextManager,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x6a8ec5);
  gmlc::networking::AsioContextManager::startContextLoop(in_stack_00000108);
  return;
}

Assistant:

MessageTimer::MessageTimer(std::function<void(ActionMessage&&)> sFunction):
    sendFunction(std::move(sFunction)),
    contextPtr(gmlc::networking::AsioContextManager::getContextPointer()),
    loopHandle(contextPtr->startContextLoop())
{
}